

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::checkConfiguration(QPDFJob *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  char *pcVar6;
  const_iterator cVar7;
  undefined8 extraout_RAX;
  byte bVar8;
  byte bVar9;
  element_type *peVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R15;
  string local_68;
  key_type local_48;
  
  peVar10 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar10->replace_input == true) {
    if ((peVar10->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_0017224d;
    if (peVar10->split_pages == 0) {
      if (peVar10->json_version != 0) {
        peVar10 = (element_type *)&local_68.field_2;
        local_68._M_dataplus._M_p = (pointer)peVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"--json may not be used with --replace-input","");
        usage(&local_68);
        goto LAB_00171ef8;
      }
      goto LAB_00171f8c;
    }
LAB_00172274:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"--split-pages may not be used with --replace-input","");
    usage(&local_68);
LAB_0017229b:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"--replace-input may not be used with --empty","");
    usage(&local_68);
LAB_001722c2:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"no output file may be given for this option","");
    usage(&local_68);
LAB_001722e9:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "--requires-password and --is-encrypted may not be given together","");
    usage(&local_68);
LAB_00172310:
    local_68._M_dataplus._M_p = (pointer)unaff_R15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "json keys \"objects\" and \"objectinfo\" are only valid for json version 1","");
    usage(&local_68);
  }
  else {
LAB_00171ef8:
    if ((peVar10->json_version != 0) &&
       ((peVar10->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"-","");
      QUtil::make_shared_cstr((QUtil *)&local_48,&local_68);
      sVar4 = local_48._M_string_length;
      _Var3._M_p = local_48._M_dataplus._M_p;
      peVar10 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48._M_dataplus._M_p = (pointer)0x0;
      local_48._M_string_length = 0;
      this_00 = (peVar10->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (peVar10->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           _Var3._M_p;
      (peVar10->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      peVar10 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
LAB_00171f8c:
    pcVar6 = (peVar10->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pcVar6 == (char *)0x0) {
LAB_00172226:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"an input file name is required","");
      usage(&local_68);
LAB_0017224d:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "--replace-input may not be used when an output file is specified","");
      usage(&local_68);
      goto LAB_00172274;
    }
    if ((peVar10->replace_input == true) && (*pcVar6 == '\0')) goto LAB_0017229b;
    bVar8 = peVar10->require_outfile;
    pcVar6 = (peVar10->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar9 = pcVar6 != (char *)0x0 | peVar10->replace_input;
    if ((bool)bVar8 != true) {
LAB_00171ffa:
      if (bVar9 == 0) {
        pcVar6 = (char *)0x0;
        goto LAB_00172005;
      }
      goto LAB_001722c2;
    }
    if (bVar9 == 0) {
      peVar10 = (element_type *)&local_68.field_2;
      bVar9 = 0xb5;
      local_68._M_dataplus._M_p = (pointer)peVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"an output file name is required; use - for standard output",""
                );
      usage(&local_68);
      goto LAB_00171ffa;
    }
LAB_00172005:
    if ((peVar10->check_requires_password == true) && (peVar10->check_is_encrypted == true))
    goto LAB_001722e9;
    if (((peVar10->encrypt == true) &&
        (((peVar10->allow_insecure == false && ((peVar10->owner_password)._M_string_length == 0)) &&
         ((peVar10->user_password)._M_string_length != 0)))) && (peVar10->keylen == 0x100))
    goto LAB_00172358;
    if ((((bVar8 & pcVar6 != (char *)0x0) == 1) && (*pcVar6 == '-')) && (pcVar6[1] == '\0')) {
      if (peVar10->split_pages != 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "--split-pages may not be used when writing to standard output","");
        usage(&local_68);
        goto LAB_00172226;
      }
LAB_0017207c:
      QPDFLogger::saveToStandardOutput
                ((QPDFLogger *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&peVar10->log)->_M_allocated_capacity,true);
      peVar10 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else if ((peVar10->attachment_to_show)._M_string_length != 0) goto LAB_0017207c;
    if (peVar10->split_pages != 0) {
LAB_001720b1:
      if (peVar10->json_version == 1) {
        paVar1 = &local_68.field_2;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"qpdf","");
        this = (QPDFJob *)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(peVar10->json_keys)._M_t,&local_68);
        peVar10 = (element_type *)&(peVar10->json_keys)._M_t._M_impl.super__Rb_tree_header;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)this == peVar10) {
          return;
        }
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"json key \"qpdf\" is only valid for json version > 1","");
        usage(&local_68);
      }
      unaff_R15 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)unaff_R15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"objectinfo","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(peVar10->json_keys)._M_t,&local_68);
      bVar5 = true;
      if ((_Rb_tree_header *)cVar7._M_node ==
          &(peVar10->json_keys)._M_t._M_impl.super__Rb_tree_header) {
        lVar2 = *(long *)this;
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"objects","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(lVar2 + 0x290),&local_48);
        bVar5 = cVar7._M_node != (_Base_ptr)(lVar2 + 0x298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != unaff_R15) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) {
        return;
      }
      goto LAB_00172310;
    }
    bVar5 = QUtil::same_file((peVar10->infilename).
                             super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (peVar10->outfilename).
                             super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (!bVar5) {
      peVar10 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      goto LAB_001720b1;
    }
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "input file and output file are the same; use --replace-input to intentionally overwrite the input file"
             ,"");
  usage(&local_68);
LAB_00172358:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "A PDF with a non-empty user password and an empty owner password encrypted with a 256-bit key is insecure as it can be opened without a password. If you really want to do this, you must also give the --allow-insecure option before the -- that follows --encrypt."
             ,"");
  usage(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
QPDFJob::checkConfiguration()
{
    // Do final checks for command-line consistency. (I always think this is called doFinalChecks,
    // so I'm putting that in a comment.)

    if (m->replace_input) {
        // Check for --empty appears later after we have checked m->infilename.
        if (m->outfilename) {
            usage("--replace-input may not be used when an output file is specified");
        } else if (m->split_pages) {
            usage("--split-pages may not be used with --replace-input");
        } else if (m->json_version) {
            usage("--json may not be used with --replace-input");
        }
    }
    if (m->json_version && (m->outfilename == nullptr)) {
        // The output file is optional with --json for backward compatibility and defaults to
        // standard output.
        m->outfilename = QUtil::make_shared_cstr("-");
    }
    if (m->infilename == nullptr) {
        usage("an input file name is required");
    } else if (m->replace_input && (strlen(m->infilename.get()) == 0)) {
        usage("--replace-input may not be used with --empty");
    } else if (m->require_outfile && (m->outfilename == nullptr) && (!m->replace_input)) {
        usage("an output file name is required; use - for standard output");
    } else if ((!m->require_outfile) && ((m->outfilename != nullptr) || m->replace_input)) {
        usage("no output file may be given for this option");
    }
    if (m->check_requires_password && m->check_is_encrypted) {
        usage("--requires-password and --is-encrypted may not be given together");
    }

    if (m->encrypt && (!m->allow_insecure) &&
        (m->owner_password.empty() && (!m->user_password.empty()) && (m->keylen == 256))) {
        // Note that empty owner passwords for R < 5 are copied from the user password, so this lack
        // of security is not an issue for those files. Also we are consider only the ability to
        // open the file without a password to be insecure. We are not concerned about whether the
        // viewer enforces security settings when the user and owner password match.
        usage(
            "A PDF with a non-empty user password and an empty owner password encrypted with a "
            "256-bit key is insecure as it can be opened without a password. If you really want to"
            " do this, you must also give the --allow-insecure option before the -- that follows "
            "--encrypt.");
    }

    bool save_to_stdout = false;
    if (m->require_outfile && m->outfilename && (strcmp(m->outfilename.get(), "-") == 0)) {
        if (m->split_pages) {
            usage("--split-pages may not be used when writing to standard output");
        }
        save_to_stdout = true;
    }
    if (!m->attachment_to_show.empty()) {
        save_to_stdout = true;
    }
    if (save_to_stdout) {
        m->log->saveToStandardOutput(true);
    }
    if ((!m->split_pages) && QUtil::same_file(m->infilename.get(), m->outfilename.get())) {
        QTC::TC("qpdf", "QPDFJob same file error");
        usage(
            "input file and output file are the same; use --replace-input to intentionally "
            "overwrite the input file");
    }

    if (m->json_version == 1) {
        if (m->json_keys.count("qpdf")) {
            usage("json key \"qpdf\" is only valid for json version > 1");
        }
    } else {
        if (m->json_keys.count("objectinfo") || m->json_keys.count("objects")) {
            usage("json keys \"objects\" and \"objectinfo\" are only valid for json version 1");
        }
    }
}